

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readtest.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  __off_t _Var3;
  uint uVar4;
  char buf [128];
  
  iVar1 = open("my_test.random",0);
  if (iVar1 < 0) {
    perror("open my_test.random error");
    iVar1 = 1;
  }
  else {
    uVar4 = 0;
    while( true ) {
      if (uVar4 == 1000000) {
        close(iVar1);
        exit(0);
      }
      sVar2 = read(iVar1,buf,0x80);
      if ((int)(uint)sVar2 < 0) break;
      if ((uint)sVar2 < 0x80) {
        fprintf(_stderr,"Seek count=%d\n",(ulong)uVar4);
        _Var3 = lseek(iVar1,0,0);
        if (_Var3 < 0) {
          perror("lseek");
          iVar1 = 3;
          goto LAB_00101257;
        }
      }
      uVar4 = uVar4 + 1;
    }
    perror("read");
    iVar1 = 2;
  }
LAB_00101257:
  exit(iVar1);
}

Assistant:

int main(){

  char buf[TEST_BUF_SIZE];
  int fd, i, numbytes;

  fd = open(FILE_NAME, O_RDONLY);
  if (fd < 0) {
    perror("open " FILE_NAME " error");
    exit(1);
  }

  /* read 1M till end of file, then seek to start */

  for (i = 0; i < MAX_READS; i++) {
    numbytes = read(fd, buf, TEST_BUF_SIZE);
    if (numbytes < 0) {
      perror("read");
      exit(2);
    }
    if (numbytes < TEST_BUF_SIZE) { /* partial read or EOF, seek to start */
      fprintf(stderr, "Seek count=%d\n", i);
      if (lseek(fd, 0, SEEK_SET) < 0) {
	perror("lseek");
	exit(3);
      }
    }
  }
  close(fd);
  exit(0);
}